

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PZMatrixMarket.cpp
# Opt level: O3

void TPZMatrixMarket::Read<long_double>(string *filename,TPZSBMatrix<long_double> *fmat)

{
  char cVar1;
  istream *piVar2;
  int64_t nonzero;
  int64_t col;
  int64_t row;
  string buf;
  int64_t ncol;
  int64_t nrow;
  ifstream input;
  undefined1 *local_280;
  undefined8 local_278;
  undefined1 local_270;
  undefined7 uStack_26f;
  undefined8 local_260;
  undefined8 local_258;
  string *local_250;
  long local_238 [65];
  
  local_250 = filename;
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  local_280 = &local_270;
  local_278 = 0;
  local_270 = 0;
  cVar1 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_280,cVar1);
  piVar2 = std::istream::_M_extract<long>(local_238);
  piVar2 = std::istream::_M_extract<long>((long *)piVar2);
  std::istream::_M_extract<long>((long *)piVar2);
  if (local_280 != &local_270) {
    operator_delete(local_280,CONCAT71(uStack_26f,local_270) + 1);
  }
  std::ifstream::~ifstream(local_238);
  (*(fmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (fmat,local_258,local_260);
  TPZSBMatrix<long_double>::SetBand(fmat,0);
  std::ifstream::ifstream(local_238,(string *)local_250,_S_in);
  local_280 = &local_270;
  local_278 = 0;
  local_270 = 0;
  cVar1 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_280,cVar1);
  piVar2 = std::istream::_M_extract<long>(local_238);
  piVar2 = std::istream::_M_extract<long>((long *)piVar2);
  std::istream::_M_extract<long>((long *)piVar2);
  if (local_280 != &local_270) {
    operator_delete(local_280,CONCAT71(uStack_26f,local_270) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void TPZMatrixMarket::Read(std::string filename, TPZSBMatrix<T>&fmat)
{
    int64_t nrow,ncol,nonzero=0,nsup=0,nlower=0, band=0;
    {
        std::ifstream input(filename);
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            if(row-col > band) band = row-col;
            if(col-row > band) band = col-row;
            row--;
            col--;
            if(row > col) nlower++;
            if(row< col ) nsup++;
        }
    }
    fmat.Redim(nrow,ncol);
    fmat.SetBand(band);
    {
        std::ifstream input(filename);
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            row--;
            col--;
            fmat.PutVal(row,col,val);
        }
    }
}